

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O1

wchar_t open_filename(archive_conflict *a,wchar_t mbs_fn,void *filename)

{
  wchar_t wVar1;
  undefined4 *client_data;
  int *piVar2;
  char *fmt;
  
  client_data = (undefined4 *)calloc(1,0x70);
  if (client_data != (undefined4 *)0x0) {
    if (mbs_fn == L'\0') {
      wVar1 = archive_mstring_copy_wcs((archive_mstring *)(client_data + 2),(wchar_t *)filename);
    }
    else {
      wVar1 = archive_mstring_copy_mbs((archive_mstring *)(client_data + 2),(char *)filename);
    }
    if (L'\xffffffff' < wVar1) {
      *client_data = 0xffffffff;
      wVar1 = archive_write_open2((archive *)a,client_data,file_open,file_write,file_close,file_free
                                 );
      return wVar1;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0xc) {
      if (mbs_fn == L'\0') {
        fmt = "Can\'t convert \'%ls\' to MBS";
      }
      else {
        fmt = "Can\'t convert \'%s\' to WCS";
      }
      archive_set_error((archive *)a,-1,fmt,filename);
      return L'\xffffffe7';
    }
  }
  archive_set_error((archive *)a,0xc,"No memory");
  return L'\xffffffe2';
}

Assistant:

static int
open_filename(struct archive *a, int mbs_fn, const void *filename)
{
	struct write_file_data *mine;
	int r;

	mine = calloc(1, sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	if (mbs_fn)
		r = archive_mstring_copy_mbs(&mine->filename, filename);
	else
		r = archive_mstring_copy_wcs(&mine->filename, filename);
	if (r < 0) {
		if (errno == ENOMEM) {
			archive_set_error(a, ENOMEM, "No memory");
			return (ARCHIVE_FATAL);
		}
		if (mbs_fn)
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "Can't convert '%s' to WCS",
			    (const char *)filename);
		else
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "Can't convert '%ls' to MBS",
			    (const wchar_t *)filename);
		return (ARCHIVE_FAILED);
	}
	mine->fd = -1;
	return (archive_write_open2(a, mine,
		    file_open, file_write, file_close, file_free));
}